

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.hpp
# Opt level: O0

void __thiscall Args::Command::process(Command *this,Context *ctx)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  ArgIface *in_RDI;
  value_type *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  CmdLine **this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffea8;
  int iVar1;
  string local_150 [8];
  CmdLine *in_stack_fffffffffffffeb8;
  String *in_stack_fffffffffffffec0;
  Context *in_stack_fffffffffffffec8;
  allocator local_129;
  string local_128 [16];
  CmdLine *in_stack_fffffffffffffee8;
  String *in_stack_fffffffffffffef0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffef8;
  Context *in_stack_ffffffffffffff00;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [55];
  allocator local_71;
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  *(undefined1 *)&in_RDI[0xb]._vptr_ArgIface = 1;
  iVar1 = *(int *)((long)&in_RDI[4].m_cmdLine + 4);
  if (iVar1 == 1) {
    this_00 = &in_RDI[0xb].m_cmdLine;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"Command \"",&local_129);
    (*in_RDI->_vptr_ArgIface[3])(local_150);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar1,in_stack_fffffffffffffea8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    std::operator+(in_RSI,(char *)this_00);
    ArgIface::cmdLine(in_RDI);
    eatOneValue<Args::CmdLine,Args::Context>
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00,in_stack_fffffffffffffe68);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
    std::__cxx11::string::~string(local_150);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
  }
  else if (iVar1 == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Command \"",&local_71);
    (*in_RDI->_vptr_ArgIface[3])(local_a8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar1,in_stack_fffffffffffffea8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    ArgIface::cmdLine(in_RDI);
    eatValues<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Args::CmdLine,Args::Context>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8);
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  return;
}

Assistant:

void process(
		//! Context of the command line.
		Context & ctx ) override
	{
		m_isDefined = true;

		switch( m_opt )
		{
			case ValueOptions::ManyValues :
			{
				eatValues( ctx, m_values,
					String( SL( "Command \"" ) ) +
						name() + SL( "\" requires value that wasn't presented." ),
					cmdLine() );
			}
				break;

			case ValueOptions::OneValue :
			{
				m_values.push_back( eatOneValue( ctx,
					String( SL( "Command \"" ) ) + name() +
						SL( "\" requires value that wasn't presented." ),
					cmdLine() ) );
			}
				break;

			default :
				break;
		}
	}